

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_freeze(HSQUIRRELVM v,SQInteger idx)

{
  SQUnsignedInteger *pSVar1;
  ulong uVar2;
  bool bVar3;
  SQObjectPtr *o;
  SQRESULT SVar4;
  SQObjectPtr dst;
  
  o = stack_get(v,idx);
  bVar3 = validate_freezable(v,o);
  if (bVar3) {
    uVar2._0_4_ = (o->super_SQObject)._type;
    uVar2._4_1_ = (o->super_SQObject)._flags;
    uVar2._5_3_ = *(undefined3 *)&(o->super_SQObject).field_0x5;
    dst.super_SQObject._unVal = (SQObjectValue)(o->super_SQObject)._unVal.pTable;
    if ((uVar2 & 0x8000000) != 0) {
      pSVar1 = &((dst.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
                super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    dst.super_SQObject._0_8_ = uVar2 | 0x100000000;
    SQVM::Push(v,&dst);
    SQObjectPtr::~SQObjectPtr(&dst);
    SVar4 = 0;
  }
  else {
    SVar4 = -1;
  }
  return SVar4;
}

Assistant:

SQRESULT sq_freeze(HSQUIRRELVM v, SQInteger idx)
{
    SQObjectPtr &o = stack_get(v, idx);
    if (!validate_freezable(v, o))
        return SQ_ERROR;

    SQObjectPtr dst = o;
    dst._flags |= SQOBJ_FLAG_IMMUTABLE;
    v->Push(dst);
    return SQ_OK;
}